

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

QScroller * QScroller::scroller(QObject *target)

{
  bool bVar1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *this;
  Type *pTVar2;
  QScroller *pQVar3;
  QScroller *this_00;
  long in_FS_OFFSET;
  QScroller *s;
  undefined4 uStack_40;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  QObject *target_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  target_local = target;
  if (target == (QObject *)0x0) {
    s._0_4_ = 2;
    local_34 = 0;
    s._4_4_ = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_30 = "default";
    pQVar3 = (QScroller *)0x0;
    QMessageLogger::warning((char *)&s,"QScroller::scroller() was called with a null target.");
  }
  else {
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_> *)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
                       *)target);
    bVar1 = QMap<QObject_*,_QScroller_*>::contains
                      ((QMap<QObject_*,_QScroller_*> *)this,&target_local);
    if (bVar1) {
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
               ::operator()(this);
      s._0_4_ = 0;
      s._4_4_ = 0;
      pQVar3 = QMap<QObject_*,_QScroller_*>::value(pTVar2,&target_local,&s);
    }
    else {
      this_00 = (QScroller *)operator_new(0x18);
      pQVar3 = this_00;
      QScroller(this_00,target_local);
      s._0_4_ = SUB84(this_00,0);
      s._4_4_ = (undefined4)((ulong)this_00 >> 0x20);
      pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
               ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
                             *)pQVar3);
      QMap<QObject_*,_QScroller_*>::insert(pTVar2,&target_local,&s);
      pQVar3 = (QScroller *)CONCAT44(s._4_4_,s._0_4_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QScroller *QScroller::scroller(QObject *target)
{
    if (!target) {
        qWarning("QScroller::scroller() was called with a null target.");
        return nullptr;
    }

    if (qt_allScrollers()->contains(target))
        return qt_allScrollers()->value(target);

    QScroller *s = new QScroller(target);
    qt_allScrollers()->insert(target, s);
    return s;
}